

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine>::Grow
          (TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine> *this,uint amount)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = amount + this->Count;
  uVar1 = this->Most;
  if (uVar1 < uVar3) {
    uVar2 = 0x10;
    if (0xf < uVar1) {
      uVar2 = (uVar1 >> 1) + uVar1;
    }
    if (uVar2 < uVar3) {
      uVar2 = uVar3;
    }
    this->Most = uVar2;
    DoResize(this);
    return;
  }
  return;
}

Assistant:

void Grow (unsigned int amount)
	{
		if (Count + amount > Most)
		{
			const unsigned int choicea = Count + amount;
			const unsigned int choiceb = Most = (Most >= 16) ? Most + Most / 2 : 16;
			Most = (choicea > choiceb ? choicea : choiceb);
			DoResize ();
		}
	}